

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O1

int secp256k1_fe_impl_is_square_var(secp256k1_fe *x)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint64_t a4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  secp256k1_modinv64_signed62 f;
  secp256k1_fe tmp;
  undefined8 uStack_d0;
  secp256k1_fe local_c8;
  secp256k1_modinv64_trans2x2 local_a0;
  secp256k1_modinv64_signed62 local_80;
  secp256k1_fe local_58;
  
  local_58.n[4] = x->n[4];
  local_58.n[0] = x->n[0];
  local_58.n[1] = x->n[1];
  local_58.n[2] = x->n[2];
  local_58.n[3] = x->n[3];
  secp256k1_fe_impl_normalize_var(&local_58);
  if (((local_58.n[2] == 0 && local_58.n[3] == 0) && (local_58.n[1] == 0 && local_58.n[0] == 0)) &&
      local_58.n[4] == 0) {
    uVar4 = 1;
  }
  else {
    local_80.v[0] = (local_58.n[1] << 0x34 | local_58.n[0]) & 0x3fffffffffffffff;
    local_80.v[1] = (ulong)((uint)local_58.n[2] & 0xfffff) << 0x2a | local_58.n[1] >> 10;
    local_80.v[2] = (ulong)((uint)local_58.n[3] & 0x3fffffff) << 0x20 | local_58.n[2] >> 0x14;
    local_80.v[3] = (local_58.n[4] & 0xffffffffff) << 0x16 | local_58.n[3] >> 0x1e;
    local_80.v[4] = local_58.n[4] >> 0x28;
    local_c8.n[2] = 0;
    local_c8.n[3] = 0;
    local_c8.n[0] = -0x1000003d1;
    local_c8.n[1] = 0;
    local_c8.n[4] = 0x100;
    uVar4 = 5;
    lVar12 = -1;
    iVar17 = 0;
    uVar18 = 0;
    do {
      lVar5 = 0;
      if ((local_80.v[0] | 0xc000000000000000U) != 0) {
        for (; ((local_80.v[0] | 0xc000000000000000U) >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      local_a0.r = 1;
      local_a0.u = 1L << ((byte)lVar5 & 0x3f);
      lVar12 = lVar12 - lVar5;
      uVar18 = ((uint)(local_c8.n[0] >> 1) ^ (uint)(local_c8.n[0] >> 2)) & (uint)lVar5 ^ uVar18;
      if (lVar5 == 0x3e) {
        local_a0.q = 0;
        local_a0.v = 0;
      }
      else {
        uVar9 = local_c8.n[1] << 0x3e | local_c8.n[0];
        iVar3 = 0x3e - (uint)lVar5;
        uVar10 = (ulong)(local_80.v[1] << 0x3e | local_80.v[0]) >> ((byte)lVar5 & 0x3f);
        local_a0.v = 0;
        lVar5 = 0;
        do {
          iVar11 = (int)uVar9;
          iVar14 = (int)uVar10;
          bVar7 = (byte)iVar3;
          if (lVar12 < 0) {
            lVar12 = -lVar12;
            uVar18 = uVar18 ^ (uint)((uVar9 & uVar10) >> 1);
            iVar8 = (int)lVar12 + 1;
            bVar6 = (byte)iVar8;
            if (iVar3 <= iVar8) {
              bVar6 = bVar7;
            }
            uVar13 = (uint)(0xffffffffffffffff >> (-bVar6 & 0x3f)) &
                     (iVar14 * iVar14 + 0x3e) * iVar11 * iVar14 & 0x3f;
            local_a0.q = local_a0.u;
            uVar15 = uVar9;
            uVar9 = uVar10;
            lVar16 = local_a0.r;
          }
          else {
            iVar8 = (int)lVar12 + 1;
            bVar6 = (byte)iVar8;
            if (iVar3 <= iVar8) {
              bVar6 = bVar7;
            }
            uVar13 = (uint)(0xffffffffffffffff >> (-bVar6 & 0x3f)) &
                     -(((iVar11 * 2 + 2U & 8) + iVar11) * iVar14) & 0xf;
            local_a0.q = lVar5;
            uVar15 = uVar10;
            lVar5 = local_a0.u;
            lVar16 = local_a0.v;
            local_a0.v = local_a0.r;
          }
          uVar10 = (ulong)uVar13;
          uVar15 = uVar10 * uVar9 + uVar15;
          local_a0.q = lVar5 * uVar10 + local_a0.q;
          local_a0.r = uVar10 * lVar16 + local_a0.v;
          uVar10 = -1L << (bVar7 & 0x3f) | uVar15;
          lVar1 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          bVar7 = (byte)lVar1;
          uVar10 = uVar15 >> (bVar7 & 0x3f);
          local_a0.u = lVar5 << (bVar7 & 0x3f);
          local_a0.v = lVar16 << (bVar7 & 0x3f);
          lVar12 = lVar12 - lVar1;
          uVar18 = ((uint)(uVar9 >> 1) ^ (uint)(uVar9 >> 2)) & (uint)lVar1 ^ uVar18;
          iVar3 = iVar3 - (uint)lVar1;
          lVar5 = local_a0.q;
        } while (iVar3 != 0);
      }
      secp256k1_modinv64_update_fg_62_var
                (uVar4,(secp256k1_modinv64_signed62 *)&local_c8,&local_80,&local_a0);
      if (local_c8.n[0] == 1) {
        if (1 < (int)uVar4) {
          uVar9 = 1;
          uVar10 = 0;
          do {
            uVar10 = uVar10 | local_c8.n[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar4 != uVar9);
          if (uVar10 != 0) goto LAB_00137444;
        }
        uStack_d0._4_4_ = 1 - (uVar18 * 2 & 2);
        bVar2 = false;
      }
      else {
LAB_00137444:
        lVar5 = (long)(int)uVar4;
        uVar13 = uVar4 - 1;
        if ((lVar5 + -2 < 0 || (&uStack_d0)[lVar5] != 0) || local_80.v[lVar5 + -1] != 0) {
          uVar13 = uVar4;
        }
        uVar4 = uVar13;
        bVar2 = true;
      }
      uVar13 = uStack_d0._4_4_;
      if (!bVar2) goto LAB_0013749d;
      iVar17 = iVar17 + 1;
    } while (iVar17 != 0x19);
    uVar13 = 0;
LAB_0013749d:
    if (uVar13 == 0) {
      uVar4 = secp256k1_fe_sqrt(&local_c8,&local_58);
    }
    else {
      uVar4 = ~uVar13 >> 0x1f;
    }
  }
  return uVar4;
}

Assistant:

static int secp256k1_fe_impl_is_square_var(const secp256k1_fe *x) {
    secp256k1_fe tmp;
    secp256k1_modinv64_signed62 s;
    int jac, ret;

    tmp = *x;
    secp256k1_fe_normalize_var(&tmp);
    /* secp256k1_jacobi64_maybe_var cannot deal with input 0. */
    if (secp256k1_fe_is_zero(&tmp)) return 1;
    secp256k1_fe_to_signed62(&s, &tmp);
    jac = secp256k1_jacobi64_maybe_var(&s, &secp256k1_const_modinfo_fe);
    if (jac == 0) {
        /* secp256k1_jacobi64_maybe_var failed to compute the Jacobi symbol. Fall back
         * to computing a square root. This should be extremely rare with random
         * input (except in VERIFY mode, where a lower iteration count is used). */
        secp256k1_fe dummy;
        ret = secp256k1_fe_sqrt(&dummy, &tmp);
    } else {
        ret = jac >= 0;
    }
    return ret;
}